

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

bool jessilib::is_valid<std::__cxx11::u16string>
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                *in_string)

{
  bool bVar1;
  decode_result dVar2;
  decode_result string_front;
  InViewT in_string_view;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *in_string_local;
  
  join_0x00000010_0x00000000_ =
       std::__cxx11::u16string::operator_cast_to_basic_string_view((u16string *)in_string);
  while( true ) {
    bVar1 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty
                      ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
                       &string_front.units);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    dVar2 = decode_codepoint<char16_t>(stack0xffffffffffffffd8);
    string_front._0_8_ = dVar2.units;
    if (string_front._0_8_ == 0) break;
    std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix
              ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&string_front.units,
               string_front._0_8_);
  }
  return false;
}

Assistant:

bool is_valid(const InT& in_string) {
	using InCharT = typename impl_unicode::is_string<InT>::type;
	using InViewT = std::basic_string_view<InCharT>;

	InViewT in_string_view = static_cast<InViewT>(in_string);
	while (!in_string_view.empty()) {
		decode_result string_front = decode_codepoint(in_string_view);
		if (string_front.units == 0) {
			return false;
		}
		in_string_view.remove_prefix(string_front.units);
	}

	return true;
}